

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::get_text_drawing_size(char *text,int fontpixelsize,int *w,int *h)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  *w = 0;
  *h = 0;
  sVar3 = strlen(text);
  uVar4 = 0;
  uVar5 = sVar3 & 0xffffffff;
  if ((int)sVar3 < 1) {
    uVar5 = uVar4;
  }
  iVar6 = 0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    cVar1 = text[uVar4];
    if (cVar1 == 10) {
      if (iVar6 < *w) {
        iVar6 = *w;
      }
      *w = iVar6;
      *h = *h + fontpixelsize * 2;
      iVar6 = 0;
    }
    iVar2 = isprint((int)cVar1);
    if (iVar2 != 0) {
      iVar2 = fontpixelsize;
    }
    iVar6 = iVar6 + iVar2;
  }
  if (iVar6 < *w) {
    iVar6 = *w;
  }
  *w = iVar6;
  *h = *h + fontpixelsize * 2;
  return;
}

Assistant:

void get_text_drawing_size(const char* text, int fontpixelsize, int* w, int* h)
{
    *w = 0;
    *h = 0;

    const int n = strlen(text);

    int line_w = 0;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            *w = std::max(*w, line_w);
            *h += fontpixelsize * 2;
            line_w = 0;
        }

        if (isprint(ch) != 0)
        {
            line_w += fontpixelsize;
        }
    }

    *w = std::max(*w, line_w);
    *h += fontpixelsize * 2;
}